

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool fast_float::small_mul<(unsigned_short)62>(stackvec<(unsigned_short)62> *vec,limb y)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  size_t index;
  ulong uVar6;
  
  uVar1 = vec->length;
  uVar5 = 0;
  for (uVar6 = 0; auVar4._8_8_ = 0, auVar4._0_8_ = uVar5, uVar1 != uVar6; uVar6 = uVar6 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = y;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = vec->data[uVar6];
    auVar4 = auVar2 * auVar3 + auVar4;
    uVar5 = auVar4._8_8_;
    vec->data[uVar6] = auVar4._0_8_;
  }
  if (uVar5 != 0) {
    if (0x3d < uVar1) {
      return false;
    }
    vec->data[uVar1] = uVar5;
    vec->length = uVar1 + 1;
  }
  return true;
}

Assistant:

inline bool small_mul(stackvec<size>& vec, limb y) noexcept {
  limb carry = 0;
  for (size_t index = 0; index < vec.len(); index++) {
    vec[index] = scalar_mul(vec[index], y, carry);
  }
  if (carry != 0) {
    FASTFLOAT_TRY(vec.try_push(carry));
  }
  return true;
}